

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mipmap.cpp
# Opt level: O2

RGB __thiscall pbrt::MIPMap::Lookup<pbrt::RGB>(MIPMap *this,Point2f *st,Float width)

{
  Tuple2<pbrt::Point2,_float> st_00;
  FilterFunction FVar1;
  float fVar2;
  size_t sVar3;
  uint uVar4;
  Point2i PVar5;
  undefined4 extraout_var;
  Tuple2<pbrt::Point2,_int> st_01;
  uint level;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Float FVar8;
  undefined1 auVar9 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar10 [64];
  undefined1 auVar13 [56];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar15 [12];
  undefined1 auVar14 [16];
  undefined1 in_ZMM3 [64];
  undefined1 in_register_00001344 [12];
  RGB RVar16;
  int vb;
  Float FStack_3c;
  Float local_38;
  Float va;
  Float FStack_2c;
  Float local_28;
  
  auVar15 = in_ZMM3._4_12_;
  auVar10._4_60_ = in_register_00001204;
  auVar10._0_4_ = width;
  sVar3 = (this->pyramid).nStored;
  auVar9 = vmaxss_avx(SUB6416(ZEXT464(0x322bcc77),0),auVar10._0_16_);
  FVar8 = Log2(auVar9._0_4_);
  fVar2 = FVar8 + (float)((int)sVar3 + -1);
  level = (int)(this->pyramid).nStored - 1;
  if ((float)(int)level <= fVar2) {
    st_01.x = 0;
    st_01.y = 0;
LAB_00490cee:
    RVar16 = Texel<pbrt::RGB>(this,level,(Point2i)st_01);
    return RVar16;
  }
  auVar9 = vroundss_avx(ZEXT416((uint)fVar2),ZEXT416((uint)fVar2),9);
  uVar4 = (uint)auVar9._0_4_;
  level = ~((int)uVar4 >> 0x1f) & uVar4;
  FVar1 = (this->options).filter;
  if (FVar1 == Trilinear) {
    if (0 < (int)uVar4) {
      vb = 1;
      fVar2 = fVar2 - (float)(int)level;
      va = fVar2;
      if (fVar2 <= 1.0) {
        auVar13 = ZEXT856(0);
        RVar16 = Bilerp<pbrt::RGB>(this,level,(Point2f)st->super_Tuple2<pbrt::Point2,_float>);
        local_28 = RVar16.b;
        auVar11._0_8_ = RVar16._0_8_;
        auVar11._8_56_ = auVar13;
        _va = vmovlps_avx(auVar11._0_16_);
        auVar13 = ZEXT856(0);
        RVar16 = Bilerp<pbrt::RGB>(this,level + 1,(Point2f)st->super_Tuple2<pbrt::Point2,_float>);
        local_38 = RVar16.b;
        auVar12._0_8_ = RVar16._0_8_;
        auVar12._8_56_ = auVar13;
        _vb = vmovlps_avx(auVar12._0_16_);
        RVar16 = Lerp(fVar2,(RGB *)&va,(RGB *)&vb);
        return RVar16;
      }
      LogFatal<char_const(&)[6],char_const(&)[2],char_const(&)[6],float&,char_const(&)[2],int&>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/mipmap.cpp"
                 ,0xf8,"Check failed: %s <= %s with %s = %s, %s = %s",(char (*) [6])0x2e5272f,
                 (char (*) [2])0x57d060,(char (*) [6])0x2e5272f,&va,(char (*) [2])0x57d060,&vb);
    }
    st_00 = st->super_Tuple2<pbrt::Point2,_float>;
    level = 0;
  }
  else {
    if (FVar1 != Bilinear) {
      if (FVar1 != Point) {
        LogFatal<char_const(&)[44]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/mipmap.cpp"
                   ,0xf2,"Check failed: %s",
                   (char (*) [44])"options.filter == FilterFunction::Trilinear");
      }
      PVar5 = LevelResolution(this,level);
      auVar9._0_4_ = (float)PVar5.super_Tuple2<pbrt::Point2,_int>.x;
      auVar9._4_12_ = auVar15;
      auVar14._8_4_ = 0x3effffff;
      auVar14._0_8_ = 0x3effffff3effffff;
      auVar14._12_4_ = 0x3effffff;
      auVar7._8_4_ = 0x80000000;
      auVar7._0_8_ = 0x8000000080000000;
      auVar7._12_4_ = 0x80000000;
      auVar9 = vfmadd132ss_fma(auVar9,SUB6416(ZEXT464(0xbf000000),0),
                               ZEXT416((uint)(st->super_Tuple2<pbrt::Point2,_float>).x));
      auVar6 = vpternlogd_avx512vl(auVar14,auVar9,auVar7,0xf8);
      auVar9 = ZEXT416((uint)(auVar9._0_4_ + auVar6._0_4_));
      auVar9 = vroundss_avx(auVar9,auVar9,0xb);
      auVar6._0_4_ = (float)PVar5.super_Tuple2<pbrt::Point2,_int>.y;
      auVar6._4_12_ = in_register_00001344;
      auVar6 = vfmadd132ss_fma(auVar6,SUB6416(ZEXT464(0xbf000000),0),
                               ZEXT416((uint)(st->super_Tuple2<pbrt::Point2,_float>).y));
      auVar7 = vpternlogd_avx512vl(auVar14,auVar6,auVar7,0xf8);
      auVar6 = ZEXT416((uint)(auVar6._0_4_ + auVar7._0_4_));
      auVar6 = vroundss_avx(auVar6,auVar6,0xb);
      st_01 = (Tuple2<pbrt::Point2,_int>)
              (CONCAT44(extraout_var,(int)auVar9._0_4_) | (ulong)(uint)(int)auVar6._0_4_ << 0x20);
      goto LAB_00490cee;
    }
    st_00 = st->super_Tuple2<pbrt::Point2,_float>;
  }
  RVar16 = Bilerp<pbrt::RGB>(this,level,(Point2f)st_00);
  return RVar16;
}

Assistant:

T MIPMap::Lookup(const Point2f &st, Float width) const {
    // Compute MIPMap level
    int nLevels = Levels();
    Float level = nLevels - 1 + Log2(std::max<Float>(width, 1e-8));

    if (level >= Levels() - 1)
        return Texel<T>(Levels() - 1, {0, 0});

    int iLevel = std::max(0, int(std::floor(level)));
    if (options.filter == FilterFunction::Point) {
        Point2i resolution = LevelResolution(iLevel);
        Point2i sti(std::round(st[0] * resolution[0] - 0.5f),
                    std::round(st[1] * resolution[1] - 0.5f));
        return Texel<T>(iLevel, sti);
    } else if (options.filter == FilterFunction::Bilinear) {
        return Bilerp<T>(iLevel, st);
    } else {
        CHECK(options.filter == FilterFunction::Trilinear);

        if (iLevel == 0)
            return Bilerp<T>(0, st);
        else {
            Float delta = level - iLevel;
            CHECK_LE(delta, 1);
            return Lerp(delta, Bilerp<T>(iLevel, st), Bilerp<T>(iLevel + 1, st));
        }
    }
}